

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlReconciliateNs(xmlDocPtr doc,xmlNodePtr tree)

{
  int iVar1;
  xmlNsPtr pxVar2;
  int local_50;
  int local_4c;
  int i;
  int ret;
  xmlAttrPtr attr;
  xmlNodePtr node;
  xmlNsPtr n;
  int nbCache;
  int sizeCache;
  xmlNsCache *cache;
  xmlNodePtr tree_local;
  xmlDocPtr doc_local;
  
  _nbCache = (xmlNsCache *)0x0;
  n._4_4_ = 0;
  n._0_4_ = 0;
  local_4c = 0;
  if ((tree == (xmlNodePtr)0x0) || (tree->type != XML_ELEMENT_NODE)) {
    doc_local._4_4_ = -1;
  }
  else {
    attr = (xmlAttrPtr)tree;
    cache = (xmlNsCache *)tree;
    tree_local = (xmlNodePtr)doc;
    if (tree->doc == doc) {
      while (attr != (xmlAttrPtr)0x0) {
        if (attr->ns != (xmlNs *)0x0) {
          for (local_50 = 0; local_50 < (int)n; local_50 = local_50 + 1) {
            if (_nbCache[local_50].oldNs == attr->ns) {
              attr->ns = _nbCache[local_50].newNs;
              break;
            }
          }
          if (local_50 == (int)n) {
            pxVar2 = xmlNewReconciledNs((xmlNodePtr)cache,attr->ns);
            if (pxVar2 == (xmlNsPtr)0x0) {
              local_4c = -1;
            }
            else if (((int)n < n._4_4_) ||
                    (iVar1 = xmlGrowNsCache((xmlNsCache **)&nbCache,(int *)((long)&n + 4)),
                    -1 < iVar1)) {
              _nbCache[(int)n].newNs = pxVar2;
              _nbCache[(int)n].oldNs = attr->ns;
              n._0_4_ = (int)n + 1;
            }
            else {
              local_4c = -1;
            }
            attr->ns = pxVar2;
          }
        }
        if (attr->type == XML_ELEMENT_NODE) {
          for (_i = attr->psvi; _i != (void *)0x0; _i = *(void **)((long)_i + 0x30)) {
            if (*(long *)((long)_i + 0x48) != 0) {
              for (local_50 = 0; local_50 < (int)n; local_50 = local_50 + 1) {
                if (_nbCache[local_50].oldNs == *(xmlNsPtr *)((long)_i + 0x48)) {
                  *(xmlNsPtr *)((long)_i + 0x48) = _nbCache[local_50].newNs;
                  break;
                }
              }
              if (local_50 == (int)n) {
                pxVar2 = xmlNewReconciledNs((xmlNodePtr)cache,*(xmlNsPtr *)((long)_i + 0x48));
                if (pxVar2 == (xmlNsPtr)0x0) {
                  local_4c = -1;
                }
                else if (((int)n < n._4_4_) ||
                        (iVar1 = xmlGrowNsCache((xmlNsCache **)&nbCache,(int *)((long)&n + 4)),
                        -1 < iVar1)) {
                  _nbCache[(int)n].newNs = pxVar2;
                  _nbCache[(int)n].oldNs = *(xmlNsPtr *)((long)_i + 0x48);
                  n._0_4_ = (int)n + 1;
                }
                else {
                  local_4c = -1;
                }
                *(xmlNsPtr *)((long)_i + 0x48) = pxVar2;
              }
            }
          }
        }
        if ((attr->children == (_xmlNode *)0x0) || (attr->type == XML_ENTITY_REF_NODE)) {
          if ((attr == (xmlAttrPtr)cache) || (attr->next == (_xmlAttr *)0x0)) {
            if (attr == (xmlAttrPtr)cache) break;
            do {
              if (attr == (xmlAttrPtr)cache) goto LAB_0016cac7;
              if (attr->parent != (_xmlNode *)0x0) {
                attr = (xmlAttrPtr)attr->parent;
              }
              if ((attr != (xmlAttrPtr)cache) && (attr->next != (_xmlAttr *)0x0)) {
                attr = attr->next;
                goto LAB_0016cac7;
              }
            } while (attr->parent != (_xmlNode *)0x0);
            attr = (xmlAttrPtr)0x0;
LAB_0016cac7:
            if (attr == (xmlAttrPtr)cache) {
              attr = (xmlAttrPtr)0x0;
            }
          }
          else {
            attr = attr->next;
          }
        }
        else {
          attr = (xmlAttrPtr)attr->children;
        }
      }
      if (_nbCache != (xmlNsCache *)0x0) {
        (*xmlFree)(_nbCache);
      }
      doc_local._4_4_ = local_4c;
    }
    else {
      doc_local._4_4_ = -1;
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlReconciliateNs(xmlDocPtr doc, xmlNodePtr tree) {
    xmlNsCache *cache = NULL;
    int sizeCache = 0;
    int nbCache = 0;

    xmlNsPtr n;
    xmlNodePtr node = tree;
    xmlAttrPtr attr;
    int ret = 0, i;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) return(-1);
    if (node->doc != doc) return(-1);
    while (node != NULL) {
        /*
	 * Reconciliate the node namespace
	 */
	if (node->ns != NULL) {
	    for (i = 0; i < nbCache; i++) {
	        if (cache[i].oldNs == node->ns) {
		    node->ns = cache[i].newNs;
		    break;
		}
	    }
	    if (i == nbCache) {
	        /*
		 * OK we need to recreate a new namespace definition
		 */
		n = xmlNewReconciledNs(tree, node->ns);
		if (n == NULL) {
                    ret = -1;
                } else {
		    /*
		     * check if we need to grow the cache buffers.
		     */
		    if ((sizeCache <= nbCache) &&
                        (xmlGrowNsCache(&cache, &sizeCache) < 0)) {
                        ret = -1;
		    } else {
                        cache[nbCache].newNs = n;
                        cache[nbCache++].oldNs = node->ns;
                    }
                }
		node->ns = n;
	    }
	}
	/*
	 * now check for namespace held by attributes on the node.
	 */
	if (node->type == XML_ELEMENT_NODE) {
	    attr = node->properties;
	    while (attr != NULL) {
		if (attr->ns != NULL) {
		    for (i = 0; i < nbCache; i++) {
			if (cache[i].oldNs == attr->ns) {
			    attr->ns = cache[i].newNs;
			    break;
			}
		    }
		    if (i == nbCache) {
			/*
			 * OK we need to recreate a new namespace definition
			 */
			n = xmlNewReconciledNs(tree, attr->ns);
			if (n == NULL) {
                            ret = -1;
                        } else {
			    /*
			     * check if we need to grow the cache buffers.
			     */
                            if ((sizeCache <= nbCache) &&
                                (xmlGrowNsCache(&cache, &sizeCache) < 0)) {
                                ret = -1;
                            } else {
                                cache[nbCache].newNs = n;
                                cache[nbCache++].oldNs = attr->ns;
			    }
			}
			attr->ns = n;
		    }
		}
		attr = attr->next;
	    }
	}

	/*
	 * Browse the full subtree, deep first
	 */
        if ((node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
	    /* deep first */
	    node = node->children;
	} else if ((node != tree) && (node->next != NULL)) {
	    /* then siblings */
	    node = node->next;
	} else if (node != tree) {
	    /* go up to parents->next if needed */
	    while (node != tree) {
	        if (node->parent != NULL)
		    node = node->parent;
		if ((node != tree) && (node->next != NULL)) {
		    node = node->next;
		    break;
		}
		if (node->parent == NULL) {
		    node = NULL;
		    break;
		}
	    }
	    /* exit condition */
	    if (node == tree)
	        node = NULL;
	} else
	    break;
    }
    if (cache != NULL)
	xmlFree(cache);
    return(ret);
}